

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall tcu::anon_unknown_75::unpackRGB999E5(anon_unknown_75 *this,deUint32 color)

{
  float fVar1;
  float y_;
  undefined8 extraout_XMM0_Qa;
  ulong uVar2;
  Vec4 VVar3;
  float b;
  float g;
  float r;
  float e;
  deUint32 rs;
  deUint32 gs;
  deUint32 bs;
  deUint32 exp;
  int eBias;
  int mBits;
  deUint32 color_local;
  
  fVar1 = deFloatPow(2.0,(float)(int)((color >> 0x1b) - 0x18));
  y_ = (float)(color >> 9 & 0x1ff) * fVar1;
  uVar2 = (ulong)(uint)y_;
  Vector<float,_4>::Vector
            ((Vector<float,_4> *)this,(float)(color & 0x1ff) * fVar1,y_,
             (float)(color >> 0x12 & 0x1ff) * fVar1,1.0);
  VVar3.m_data[2] = (float)(int)uVar2;
  VVar3.m_data[3] = (float)(int)(uVar2 >> 0x20);
  VVar3.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar3.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar3.m_data;
}

Assistant:

tcu::Vec4 unpackRGB999E5 (deUint32 color)
{
	const int	mBits	= 9;
	const int	eBias	= 15;

	deUint32	exp		= color >> 27;
	deUint32	bs		= (color >> 18) & ((1<<9)-1);
	deUint32	gs		= (color >> 9) & ((1<<9)-1);
	deUint32	rs		= color & ((1<<9)-1);

	float		e		= deFloatPow(2.0f, (float)((int)exp - eBias - mBits));
	float		r		= (float)rs * e;
	float		g		= (float)gs * e;
	float		b		= (float)bs * e;

	return tcu::Vec4(r, g, b, 1.0f);
}